

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_read_header(p_ply ply)

{
  int iVar1;
  uint uVar2;
  e_ply_storage_mode eVar3;
  e_ply_type eVar4;
  long in_RAX;
  ushort **ppuVar5;
  t_ply_idriver_conflict *ptVar6;
  p_ply_element __dest;
  p_ply_property __dest_00;
  size_t sVar7;
  char *pcVar8;
  long local_38;
  
  local_38 = in_RAX;
  iVar1 = BREFILL(ply);
  if (iVar1 == 0) {
    pcVar8 = "Unable to read magic number from file";
  }
  else {
    if (((ply->buffer[0] == 'p') && (ply->buffer[1] == 'l')) && (ply->buffer[2] == 'y')) {
      ppuVar5 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar5 + (long)ply->buffer[3] * 2 + 1) & 0x20) != 0) {
        uVar2 = 0;
        if (ply->buffer[3] == '\r') {
          uVar2 = (uint)(ply->buffer[4] == '\n');
        }
        ply->rn = uVar2;
        ply->buffer_first = ply->buffer_first + 3;
        iVar1 = ply_read_word(ply);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = strcmp(ply->buffer + ply->buffer_token,"format");
        if ((iVar1 == 0) && (iVar1 = ply_read_word(ply), iVar1 != 0)) {
          eVar3 = ply_find_string(ply->buffer + ply->buffer_token,ply_storage_mode_list);
          ply->storage_mode = eVar3;
          if (eVar3 != ~PLY_BIG_ENDIAN) {
            if (eVar3 == PLY_ASCII) {
              ptVar6 = &ply_idriver_ascii;
            }
            else if (eVar3 == PLY_LITTLE_ENDIAN) {
              ptVar6 = &ply_idriver_binary;
            }
            else {
              ptVar6 = &ply_idriver_binary_reverse;
            }
            ply->idriver = ptVar6;
            iVar1 = ply_read_word(ply);
            if (((iVar1 != 0) && (iVar1 = strcmp(ply->buffer + ply->buffer_token,"1.0"), iVar1 == 0)
                ) && (iVar1 = ply_read_word(ply), iVar1 != 0)) {
LAB_0013e3af:
              do {
                do {
                  iVar1 = strcmp(ply->buffer + ply->buffer_token,"end_header");
                  if (iVar1 == 0) {
                    if (ply->rn == 0) {
                      return 1;
                    }
                    sVar7 = ply->buffer_first;
                    if (ply->buffer_last == sVar7) {
                      iVar1 = BREFILL(ply);
                      if (iVar1 == 0) {
                        pcVar8 = "Unexpected end of file";
                        goto LAB_0013e2fe;
                      }
                      sVar7 = ply->buffer_first;
                    }
                    ply->buffer_first = sVar7 + 1;
                    return 1;
                  }
                  iVar1 = ply_read_header_comment(ply);
                } while (iVar1 != 0);
                iVar1 = strcmp(ply->buffer + ply->buffer_token,"element");
                if (((iVar1 == 0) && (__dest = ply_grow_element(ply), __dest != (p_ply_element)0x0))
                   && (iVar1 = ply_read_word(ply), iVar1 != 0)) {
                  strcpy(__dest->name,ply->buffer + ply->buffer_token);
                  iVar1 = ply_read_word(ply);
                  if (iVar1 != 0) {
                    iVar1 = __isoc99_sscanf(ply->buffer + ply->buffer_token,"%ld",&local_38);
                    if (iVar1 == 1) {
                      __dest->ninstances = local_38;
                      iVar1 = ply_read_word(ply);
                      if (iVar1 != 0) {
LAB_0013e475:
                        do {
                          iVar1 = strcmp(ply->buffer + ply->buffer_token,"property");
                          if (((iVar1 == 0) &&
                              (__dest_00 = ply_grow_property(ply,ply->element + ply->nelements + -1)
                              , __dest_00 != (p_ply_property)0x0)) &&
                             (iVar1 = ply_read_word(ply), iVar1 != 0)) {
                            eVar4 = ply_find_string(ply->buffer + ply->buffer_token,ply_type_list);
                            __dest_00->type = eVar4;
                            if (eVar4 != ~PLY_INT8) {
                              if (eVar4 == PLY_LIST) {
                                iVar1 = ply_read_word(ply);
                                if (iVar1 != 0) {
                                  eVar4 = ply_find_string(ply->buffer + ply->buffer_token,
                                                          ply_type_list);
                                  __dest_00->length_type = eVar4;
                                  if ((eVar4 != ~PLY_INT8) &&
                                     (iVar1 = ply_read_word(ply), iVar1 != 0)) {
                                    eVar4 = ply_find_string(ply->buffer + ply->buffer_token,
                                                            ply_type_list);
                                    __dest_00->value_type = eVar4;
                                    if (eVar4 != ~PLY_INT8) goto LAB_0013e56b;
                                  }
                                }
                              }
                              else {
LAB_0013e56b:
                                iVar1 = ply_read_word(ply);
                                if (iVar1 != 0) {
                                  strcpy(__dest_00->name,ply->buffer + ply->buffer_token);
                                  iVar1 = ply_read_word(ply);
                                  if (iVar1 != 0) goto LAB_0013e475;
                                }
                              }
                            }
                          }
                          iVar1 = ply_read_header_comment(ply);
                        } while ((iVar1 != 0) || (iVar1 = ply_read_header_obj_info(ply), iVar1 != 0)
                                );
                        goto LAB_0013e3af;
                      }
                    }
                    else {
                      ply_ferror(ply,"Expected number got \'%s\'",ply->buffer + ply->buffer_token);
                    }
                  }
                }
                iVar1 = ply_read_header_obj_info(ply);
                if (iVar1 == 0) {
                  ply_ferror(ply,"Unexpected token \'%s\'",ply->buffer + ply->buffer_token);
                  return 0;
                }
              } while( true );
            }
          }
        }
        pcVar8 = "Invalid file format";
LAB_0013e2fe:
        ply_ferror(ply,pcVar8);
        return 0;
      }
    }
    pcVar8 = "Wrong magic number. Expected \'ply\'";
  }
  (*ply->error_cb)(ply,pcVar8);
  return 0;
}

Assistant:

int ply_read_header(p_ply ply) {
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (!ply_read_header_magic(ply)) return 0;
    if (!ply_read_word(ply)) return 0;
    /* parse file format */
    if (!ply_read_header_format(ply)) {
        ply_ferror(ply, "Invalid file format");
        return 0;
    }
    /* parse elements, comments or obj_infos until the end of header */
    while (strcmp(BWORD(ply), "end_header")) {
        if (!ply_read_header_comment(ply) &&
                !ply_read_header_element(ply) &&
                !ply_read_header_obj_info(ply)) {
            ply_ferror(ply, "Unexpected token '%s'", BWORD(ply));
            return 0;
        }
    }
    /* skip extra character? */
    if (ply->rn) {
        if (BSIZE(ply) < 1 && !BREFILL(ply)) {
            ply_ferror(ply, "Unexpected end of file");
            return 0;
        }
        BSKIP(ply, 1);
    }
    return 1;
}